

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

Matrix * __thiscall Layer::get(Matrix *__return_storage_ptr__,Layer *this)

{
  pointer pPVar1;
  double *pdVar2;
  uint n_col;
  double dVar3;
  
  Matrix::Matrix(__return_storage_ptr__,1,
                 (uint)(((long)(this->m_perceptrons).
                               super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->m_perceptrons).
                              super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x50));
  n_col = 0;
  while( true ) {
    pPVar1 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_perceptrons).
                       super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar1) / 0x50) <= (ulong)n_col)
    break;
    dVar3 = Perceptron::get_output(pPVar1 + n_col);
    pdVar2 = Matrix::set(__return_storage_ptr__,0,n_col);
    *pdVar2 = dVar3;
    n_col = n_col + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Layer::get() const{
    Matrix mat(1, m_perceptrons.size());

    for(uint i=0;i<m_perceptrons.size();++i) mat.set(0, i)=m_perceptrons[i].get_output();

    return mat;
}